

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkState.cpp
# Opt level: O0

void __thiscall xmrig::NetworkState::stop(NetworkState *this)

{
  nullptr_t in_RDI;
  String *unaff_retaddr;
  nullptr_t pvVar1;
  
  *(undefined1 *)((long)in_RDI + 0x178) = 0;
  *(undefined8 *)((long)in_RDI + 0x158) = 0;
  pvVar1 = in_RDI;
  String::operator=(unaff_retaddr,in_RDI);
  String::operator=(unaff_retaddr,pvVar1);
  String::operator=(unaff_retaddr,pvVar1);
  *(long *)((long)in_RDI + 0x160) = *(long *)((long)in_RDI + 0x160) + 1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x237cd2);
  return;
}

Assistant:

void xmrig::NetworkState::stop()
{
    m_active      = false;
    diff          = 0;
    m_ip          = nullptr;
    m_tls         = nullptr;
    m_fingerprint = nullptr;

    failures++;
    m_latency.clear();
}